

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_copy_unset_attributes
          (exr_context_t ctxt,int part_index,exr_const_context_t source,int src_part_index)

{
  bool bVar1;
  exr_result_t eVar2;
  uint in_ECX;
  _internal_exr_context *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  exr_attribute_t *attr;
  exr_attribute_t *srca;
  _internal_exr_part *in_stack_00000020;
  int a;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  int update_tiles;
  _internal_exr_part *srcpart;
  _internal_exr_context *srcctxt;
  exr_result_t rv;
  int local_54;
  _internal_exr_part *out;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar3;
  _internal_exr_part *part_00;
  exr_result_t local_4;
  
  iVar3 = 0;
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_4 = 2;
  }
  else {
    internal_exr_lock(in_RDI);
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      internal_exr_unlock(in_RDI);
      local_4 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      out = in_RDI->parts[(int)in_ESI];
      if (in_RDX == (_internal_exr_context *)0x0) {
        internal_exr_unlock(in_RDI);
        local_4 = 2;
      }
      else {
        if (in_RDX != in_RDI) {
          internal_exr_lock(in_RDX);
        }
        if (((int)in_ECX < 0) || (in_RDX->num_parts <= (int)in_ECX)) {
          if (in_RDX != in_RDI) {
            internal_exr_unlock(in_RDX);
          }
          internal_exr_unlock(in_RDI);
          local_4 = (*in_RDI->print_error)
                              (in_RDI,4,"Source part index (%d) out of range",(ulong)in_ECX);
        }
        else {
          part_00 = in_RDX->parts[(int)in_ECX];
          local_4 = 0;
          local_54 = 0;
          while( true ) {
            bVar1 = false;
            if (local_4 == 0) {
              bVar1 = local_54 < (part_00->attributes).num_attributes;
            }
            if (!bVar1) break;
            eVar2 = exr_attr_list_find_by_name
                              ((exr_const_context_t)part_00,
                               (exr_attribute_list_t *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),
                               (char *)in_RDI,(exr_attribute_t **)out);
            if (eVar2 == 0xf) {
              local_4 = copy_attr((exr_context_t)CONCAT44(in_ECX,0xf),in_RDX,part_00,
                                  (exr_attribute_t *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),
                                  (int *)in_RDI);
            }
            else {
              local_4 = 0;
            }
            local_54 = local_54 + 1;
          }
          if (iVar3 != 0) {
            local_4 = internal_exr_compute_tile_information
                                ((_internal_exr_context *)part,in_stack_00000020,srca._4_4_);
          }
          if (in_RDX != in_RDI) {
            internal_exr_unlock(in_RDX);
          }
          internal_exr_unlock(in_RDI);
        }
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_copy_unset_attributes (
    exr_context_t       ctxt,
    int                 part_index,
    exr_const_context_t source,
    int                 src_part_index)
{
    exr_result_t                        rv;
    const struct _internal_exr_context* srcctxt = EXR_CCTXT (source);
    struct _internal_exr_part*          srcpart;
    int                                 update_tiles = 0;
    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (!srcctxt)
        return EXR_UNLOCK_AND_RETURN_PCTXT (EXR_ERR_MISSING_CONTEXT_ARG);
    if (srcctxt != pctxt) EXR_LOCK (srcctxt);

    if (src_part_index < 0 || src_part_index >= srcctxt->num_parts)
    {
        if (srcctxt != pctxt) EXR_UNLOCK (srcctxt);
        return EXR_UNLOCK_AND_RETURN_PCTXT (pctxt->print_error (
            pctxt,
            EXR_ERR_ARGUMENT_OUT_OF_RANGE,
            "Source part index (%d) out of range",
            src_part_index));
    }

    srcpart = srcctxt->parts[src_part_index];

    rv = EXR_ERR_SUCCESS;
    for (int a = 0;
         rv == EXR_ERR_SUCCESS && a < srcpart->attributes.num_attributes;
         ++a)
    {
        const exr_attribute_t* srca = srcpart->attributes.entries[a];
        exr_attribute_t*       attr = NULL;

        rv = exr_attr_list_find_by_name (
            ctxt,
            (exr_attribute_list_t*) &(part->attributes),
            srca->name,
            &attr);
        if (rv == EXR_ERR_NO_ATTR_BY_NAME)
        {
            rv = copy_attr (ctxt, pctxt, part, srca, &update_tiles);
        }
        else
        {
            rv = EXR_ERR_SUCCESS;
        }
    }

    if (update_tiles)
        rv = internal_exr_compute_tile_information (pctxt, part, 1);

    if (srcctxt != pctxt) EXR_UNLOCK (srcctxt);
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}